

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

int xmlHashRemoveEntry3(xmlHashTablePtr hash,xmlChar *key,xmlChar *key2,xmlChar *key3,
                       xmlHashDeallocator dealloc)

{
  xmlHashEntry *pxVar1;
  xmlChar *pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  undefined4 uVar5;
  uint uVar6;
  undefined8 in_RAX;
  xmlHashEntry *__dest;
  int iVar7;
  uint uVar8;
  uint uVar9;
  xmlHashEntry *pxVar10;
  xmlHashEntry *pxVar11;
  uint uVar12;
  int found;
  int local_34;
  
  local_34 = (int)((ulong)in_RAX >> 0x20);
  iVar7 = -1;
  if (((hash != (xmlHashTablePtr)0x0) && (key != (xmlChar *)0x0)) && (hash->size != 0)) {
    uVar6 = xmlHashValue(hash->randomSeed,key,key2,key3,(size_t *)0x0);
    __dest = xmlHashFindEntry(hash,key,key2,key3,uVar6,&local_34);
    if (local_34 != 0) {
      if ((dealloc != (xmlHashDeallocator)0x0) && (__dest->payload != (void *)0x0)) {
        (*dealloc)(__dest->payload,__dest->key);
      }
      if (hash->dict == (xmlDictPtr)0x0) {
        if (__dest->key != (xmlChar *)0x0) {
          (*xmlFree)(__dest->key);
        }
        if (__dest->key2 != (xmlChar *)0x0) {
          (*xmlFree)(__dest->key2);
        }
        if (__dest->key3 != (xmlChar *)0x0) {
          (*xmlFree)(__dest->key3);
        }
      }
      uVar6 = hash->size;
      pxVar1 = hash->table;
      uVar8 = (int)((ulong)((long)__dest - (long)pxVar1) >> 3) * -0x33333333;
      uVar9 = ~uVar8;
      pxVar10 = __dest;
      do {
        pxVar11 = pxVar10;
        uVar8 = uVar8 + 1;
        pxVar10 = pxVar11 + 1;
        if ((uVar8 & uVar6 - 1) == 0) {
          pxVar10 = pxVar1;
        }
      } while ((pxVar10->hashValue != 0) &&
              (uVar12 = pxVar10->hashValue + uVar9, uVar9 = uVar9 - 1, (uVar12 & uVar6 - 1) != 0));
      pxVar10 = __dest + 1;
      if (pxVar11 < __dest) {
        memmove(__dest,pxVar10,(long)pxVar1 + ((ulong)uVar6 * 0x28 - (long)pxVar10));
        __dest = hash->table;
        uVar5 = *(undefined4 *)&__dest->field_0x4;
        pxVar2 = __dest->key;
        pxVar3 = __dest->key2;
        pxVar4 = __dest->key3;
        pxVar1[(ulong)uVar6 - 1].hashValue = __dest->hashValue;
        *(undefined4 *)&pxVar1[(ulong)uVar6 - 1].field_0x4 = uVar5;
        pxVar1[(ulong)uVar6 - 1].key = pxVar2;
        pxVar1[(ulong)uVar6 - 1].key2 = pxVar3;
        pxVar1[(ulong)uVar6 - 1].key3 = pxVar4;
        pxVar1[(ulong)uVar6 - 1].payload = __dest->payload;
        pxVar10 = __dest + 1;
      }
      memmove(__dest,pxVar10,(long)pxVar11 - (long)__dest);
      pxVar11->hashValue = 0;
      hash->nbElems = hash->nbElems - 1;
      iVar7 = 0;
    }
  }
  return iVar7;
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
int
xmlHashRemoveEntry3(xmlHashTablePtr hash, const xmlChar *key,
                    const xmlChar *key2, const xmlChar *key3,
                    xmlHashDeallocator dealloc) {
    xmlHashEntry *entry, *cur, *next;
    unsigned hashValue, mask, pos, nextpos;
    int found;

    if ((hash == NULL) || (hash->size == 0) || (key == NULL))
        return(-1);

    hashValue = xmlHashValue(hash->randomSeed, key, key2, key3, NULL);
    entry = xmlHashFindEntry(hash, key, key2, key3, hashValue, &found);
    if (!found)
        return(-1);

    if ((dealloc != NULL) && (entry->payload != NULL))
        dealloc(entry->payload, entry->key);
    if (hash->dict == NULL) {
        if (entry->key)
            xmlFree(entry->key);
        if (entry->key2)
            xmlFree(entry->key2);
        if (entry->key3)
            xmlFree(entry->key3);
    }

    /*
     * Find end of probe sequence. Entries at their initial probe
     * position start a new sequence.
     */
    mask = hash->size - 1;
    pos = entry - hash->table;
    cur = entry;

    while (1) {
        nextpos = pos + 1;
        next = cur + 1;
        if ((nextpos & mask) == 0)
            next = hash->table;

        if ((next->hashValue == 0) ||
            (((next->hashValue - nextpos) & mask) == 0))
            break;

        cur = next;
        pos = nextpos;
    }

    /*
     * Backward shift
     */
    next = entry + 1;

    if (cur < entry) {
        xmlHashEntry *end = &hash->table[hash->size];

        memmove(entry, next, (char *) end - (char *) next);
        entry = hash->table;
        end[-1] = *entry;
        next = entry + 1;
    }

    memmove(entry, next, (char *) cur - (char *) entry);

    /*
     * Update entry
     */
    cur->hashValue = 0;

    hash->nbElems--;

    return(0);
}